

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiGetTXToolInfo(ndicapi *pol,int ph)

{
  unsigned_long uVar1;
  int local_2c;
  int n;
  int i;
  char *dp;
  int ph_local;
  ndicapi *pol_local;
  
  local_2c = 0;
  while ((local_2c < pol->TxHandleCount && ((uint)pol->TxHandles[local_2c] != ph))) {
    local_2c = local_2c + 1;
  }
  if (local_2c == pol->TxHandleCount) {
    pol_local._4_4_ = 0;
  }
  else {
    uVar1 = ndiHexToUnsignedLong(pol->TxInformation[local_2c],2);
    pol_local._4_4_ = (int)uVar1;
  }
  return pol_local._4_4_;
}

Assistant:

ndicapiExport int ndiGetTXToolInfo(ndicapi* pol, int ph)
{
  char* dp;
  int i, n;

  n = pol->TxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->TxHandles[i] == ph)
    {
      break;
    }
  }
  if (i == n)
  {
    return 0;
  }

  dp = pol->TxInformation[i];
  return (int)ndiHexToUnsignedLong(dp, 2);
}